

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTagType(BinaryReaderIR *this,Index index,Index sig_index)

{
  Tag *pTVar1;
  pointer *__ptr;
  _Head_base<0UL,_wabt::TagModuleField_*,_false> local_a8;
  undefined1 local_a0 [40];
  Var local_78;
  
  GetLocation((Location *)(local_a0 + 8),this);
  std::make_unique<wabt::TagModuleField,wabt::Location>((Location *)local_a0);
  pTVar1 = (Tag *)(local_a0._0_8_ + 0x40);
  GetLocation((Location *)(local_a0 + 8),this);
  Var::Var(&local_78,sig_index,(Location *)(local_a0 + 8));
  SetFuncDeclaration(this,&pTVar1->decl,&local_78);
  Var::~Var(&local_78);
  local_a8._M_head_impl = (TagModuleField *)local_a0._0_8_;
  local_a0._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                       *)&local_a8);
  if (local_a8._M_head_impl != (TagModuleField *)0x0) {
    (*((local_a8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField
      ._vptr_ModuleField[1])();
  }
  local_a8._M_head_impl = (TagModuleField *)0x0;
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTagType(Index index, Index sig_index) {
  auto field = std::make_unique<TagModuleField>(GetLocation());
  Tag& tag = field->tag;
  SetFuncDeclaration(&tag.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}